

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O1

void bignum_mul(bn *a,bn *b,bn *c)

{
  int i;
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  bn tmp;
  bn row;
  bn local_138;
  uint local_b8 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (a == (bn *)0x0) {
    __assert_fail("a && \"a is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf7,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  if (b == (bn *)0x0) {
    __assert_fail("b && \"b is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf8,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  if (c == (bn *)0x0) {
    __assert_fail("c && \"c is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf9,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  c->array[0x1c] = 0;
  c->array[0x1d] = 0;
  c->array[0x1e] = 0;
  c->array[0x1f] = 0;
  c->array[0x18] = 0;
  c->array[0x19] = 0;
  c->array[0x1a] = 0;
  c->array[0x1b] = 0;
  c->array[0x14] = 0;
  c->array[0x15] = 0;
  c->array[0x16] = 0;
  c->array[0x17] = 0;
  c->array[0x10] = 0;
  c->array[0x11] = 0;
  c->array[0x12] = 0;
  c->array[0x13] = 0;
  c->array[0xc] = 0;
  c->array[0xd] = 0;
  c->array[0xe] = 0;
  c->array[0xf] = 0;
  c->array[8] = 0;
  c->array[9] = 0;
  c->array[10] = 0;
  c->array[0xb] = 0;
  c->array[4] = 0;
  c->array[5] = 0;
  c->array[6] = 0;
  c->array[7] = 0;
  c->array[0] = 0;
  c->array[1] = 0;
  c->array[2] = 0;
  c->array[3] = 0;
  lVar4 = 0;
  do {
    local_b8[0x1c] = 0;
    local_b8[0x1d] = 0;
    local_b8[0x1e] = 0;
    local_b8[0x1f] = 0;
    local_b8[0x18] = 0;
    local_b8[0x19] = 0;
    local_b8[0x1a] = 0;
    local_b8[0x1b] = 0;
    local_b8[0x14] = 0;
    local_b8[0x15] = 0;
    local_b8[0x16] = 0;
    local_b8[0x17] = 0;
    local_b8[0x10] = 0;
    local_b8[0x11] = 0;
    local_b8[0x12] = 0;
    local_b8[0x13] = 0;
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    lVar2 = 0;
    do {
      if ((ulong)(lVar2 + lVar4) < 0x20) {
        local_138.array._0_8_ = (ulong)b->array[lVar2] * (ulong)a->array[lVar4];
        local_138.array[2] = 0;
        local_138.array[3] = 0;
        local_138.array[0x1c] = 0;
        local_138.array[0x1d] = 0;
        local_138.array[0x1e] = 0;
        local_138.array[0x1f] = 0;
        local_138.array[0x18] = 0;
        local_138.array[0x19] = 0;
        local_138.array[0x1a] = 0;
        local_138.array[0x1b] = 0;
        local_138.array[0x14] = 0;
        local_138.array[0x15] = 0;
        local_138.array[0x16] = 0;
        local_138.array[0x17] = 0;
        local_138.array[0x10] = 0;
        local_138.array[0x11] = 0;
        local_138.array[0x12] = 0;
        local_138.array[0x13] = 0;
        local_138.array[0xc] = 0;
        local_138.array[0xd] = 0;
        local_138.array[0xe] = 0;
        local_138.array[0xf] = 0;
        local_138.array[8] = 0;
        local_138.array[9] = 0;
        local_138.array[10] = 0;
        local_138.array[0xb] = 0;
        local_138.array[4] = 0;
        local_138.array[5] = 0;
        local_138.array[6] = 0;
        local_138.array[7] = 0;
        _lshift_word(&local_138,(int)(lVar2 + lVar4));
        lVar1 = 0;
        uVar3 = 0;
        do {
          uVar3 = (ulong)local_b8[lVar1] + local_138.array[lVar1] + uVar3;
          local_b8[lVar1] = (uint)uVar3;
          uVar3 = (ulong)(uVar3 >> 0x20 != 0);
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0x20);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = (ulong)local_b8[lVar2] + c->array[lVar2] + uVar3;
      c->array[lVar2] = (uint32_t)uVar3;
      uVar3 = (ulong)(uVar3 >> 0x20 != 0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void bignum_mul(struct bn* a, struct bn* b, struct bn* c)
{
  require(a, "a is null");
  require(b, "b is null");
  require(c, "c is null");

  struct bn row;
  struct bn tmp;
  int i, j;

  bignum_init(c);

  for (i = 0; i < BN_ARRAY_SIZE; ++i)
  {
    bignum_init(&row);

    for (j = 0; j < BN_ARRAY_SIZE; ++j)
    {
      if (i + j < BN_ARRAY_SIZE)
      {
        bignum_init(&tmp);
        DTYPE_TMP intermediate = ((DTYPE_TMP)a->array[i] * (DTYPE_TMP)b->array[j]);
        bignum_from_int(&tmp, intermediate);
        _lshift_word(&tmp, i + j);
        bignum_add(&tmp, &row, &row);
      }
    }
    bignum_add(c, &row, c);
  }
}